

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O1

void __thiscall
QPDFMatrix::QPDFMatrix(QPDFMatrix *this,double a,double b,double c,double d,double e,double f)

{
  this->a = a;
  this->b = b;
  this->c = c;
  this->d = d;
  this->e = e;
  this->f = f;
  return;
}

Assistant:

QPDFMatrix::QPDFMatrix(double a, double b, double c, double d, double e, double f) :
    a(a),
    b(b),
    c(c),
    d(d),
    e(e),
    f(f)
{
}